

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::string_t,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,string_t input)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  bool bVar3;
  InvalidInputException *this_00;
  undefined8 uVar4;
  bool in_R8B;
  string_t input_00;
  string_t input_01;
  hugeint_t result;
  undefined8 local_58;
  undefined8 uStack_50;
  string local_48;
  
  uVar4 = 0;
  input_01.value.pointer.ptr = (char *)&local_58;
  input_01.value._0_8_ = input.value._8_8_;
  bVar3 = TryCast::Operation<duckdb::string_t,duckdb::hugeint_t>
                    (input.value._0_8_,input_01,(hugeint_t *)0x0,in_R8B);
  if (bVar3) {
    pdVar1 = col->data;
    iVar2 = (this->chunk).count;
    *(undefined8 *)(pdVar1 + iVar2 * 0x10) = local_58;
    *(undefined8 *)(pdVar1 + iVar2 * 0x10 + 8) = uStack_50;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.value.pointer.ptr = (char *)uVar4;
  input_00.value._0_8_ = input.value._8_8_;
  CastExceptionText<duckdb::string_t,duckdb::hugeint_t>
            (&local_48,(duckdb *)input.value._0_8_,input_00);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}